

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O0

void __thiscall
fuzzFailures_rtripconversions6_Test::TestBody(fuzzFailures_rtripconversions6_Test *this)

{
  bool bVar1;
  uint64_t match_flags;
  char *message;
  char *in_R9;
  precise_unit pVar2;
  string local_c0;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  undefined1 local_58 [8];
  precise_unit u1;
  allocator local_31;
  string local_30 [8];
  string tstring;
  fuzzFailures_rtripconversions6_Test *this_local;
  
  tstring.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,anon_var_dwarf_2cab9,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::operator+=(local_30,"+*");
  std::__cxx11::string::string((string *)&gtest_ar_.message_,local_30);
  match_flags = units::getDefaultFlags();
  pVar2 = units::unit_from_string((string *)&gtest_ar_.message_,match_flags);
  u1.multiplier_ = pVar2._8_8_;
  local_58 = (undefined1  [8])pVar2.multiplier_;
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  local_89 = units::is_error((precise_unit *)local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)local_88,(AssertionResult *)"is_error(u1)","false","true",in_R9
              );
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0xcb,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(fuzzFailures, rtripconversions6)
{
    std::string tstring = "V\xb2";
    tstring += "+*";
    auto u1 = unit_from_string(tstring);
    EXPECT_TRUE(is_error(u1));
}